

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3CodeSubselect(Parse *pParse,Expr *pExpr,int rMayHaveNull,int isRowid)

{
  int iVar1;
  int iVar2;
  Vdbe *p;
  Expr *pEVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  undefined1 local_e0 [8];
  SelectDest dest_1;
  Select *pSel;
  Expr *pEStack_c0;
  int iValToIns;
  Expr *pE2;
  int local_b0;
  int r3;
  int r2;
  int r1;
  ExprList_item *pItem;
  ExprList *pList;
  ExprList *pEStack_90;
  int i;
  ExprList *pEList;
  SelectDest dest;
  Expr *pLeft;
  char local_68 [4];
  int addr;
  KeyInfo keyInfo;
  char affinity;
  char *zMsg;
  Vdbe *v;
  int rReg;
  int testAddr;
  int isRowid_local;
  int rMayHaveNull_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  v._4_4_ = -1;
  v._0_4_ = 0;
  p = sqlite3GetVdbe(pParse);
  if (p == (Vdbe *)0x0) {
    pParse_local._4_4_ = 0;
  }
  else {
    sqlite3ExprCachePush(pParse);
    if ((pExpr->flags & 0x20) == 0) {
      v._4_4_ = sqlite3CodeOnce(pParse);
    }
    if (pParse->explain == '\x02') {
      pcVar6 = "CORRELATED ";
      if (-1 < v._4_4_) {
        pcVar6 = "";
      }
      pcVar4 = "SCALAR";
      if (pExpr->op == 'H') {
        pcVar4 = "LIST";
      }
      pcVar6 = sqlite3MPrintf(pParse->db,"EXECUTE %s%s SUBQUERY %d",pcVar6,pcVar4);
      sqlite3VdbeAddOp4(p,0x96,pParse->iSelectId,0,0,pcVar6,-1);
    }
    if ((pExpr->op == '\x14') || (pExpr->op != 'H')) {
      dest_1._8_8_ = pExpr->x;
      iVar5 = pParse->nMem + 1;
      pParse->nMem = iVar5;
      sqlite3SelectDestInit((SelectDest *)local_e0,0,iVar5);
      if (pExpr->op == 't') {
        local_e0[0] = '\x06';
        sqlite3VdbeAddOp2(p,10,0,local_e0._4_4_);
      }
      else {
        local_e0[0] = '\x03';
        sqlite3VdbeAddOp2(p,7,0,local_e0._4_4_);
      }
      sqlite3ExprDelete(pParse->db,*(Expr **)(dest_1._8_8_ + 0x68));
      pEVar3 = sqlite3PExpr(pParse,0x81,(Expr *)0x0,(Expr *)0x0,sqlite3IntTokens + 1);
      *(Expr **)(dest_1._8_8_ + 0x68) = pEVar3;
      *(undefined4 *)(dest_1._8_8_ + 0xc) = 0;
      iVar5 = sqlite3Select(pParse,(Select *)dest_1._8_8_,(SelectDest *)local_e0);
      if (iVar5 != 0) {
        return 0;
      }
      v._0_4_ = local_e0._4_4_;
    }
    else {
      dest._8_8_ = pExpr->pLeft;
      if (rMayHaveNull != 0) {
        sqlite3VdbeAddOp2(p,10,0,rMayHaveNull);
      }
      keyInfo.aColl[0]._7_1_ = sqlite3ExprAffinity((Expr *)dest._8_8_);
      iVar5 = pParse->nTab;
      pParse->nTab = iVar5 + 1;
      pExpr->iTable = iVar5;
      iVar5 = sqlite3VdbeAddOp2(p,0x2a,pExpr->iTable,(uint)((isRowid != 0 ^ 0xffU) & 1));
      if (rMayHaveNull == 0) {
        sqlite3VdbeChangeP5(p,'\b');
      }
      memset(local_68,0,0x20);
      keyInfo.db._2_2_ = 1;
      keyInfo._8_8_ = &sqlite3CodeSubselect::sortOrder;
      if ((pExpr->flags & 0x800) == 0x800) {
        sqlite3SelectDestInit((SelectDest *)&pEList,7,pExpr->iTable);
        pEList._1_1_ = keyInfo.aColl[0]._7_1_;
        ((pExpr->x).pSelect)->iLimit = 0;
        iVar1 = sqlite3Select(pParse,(pExpr->x).pSelect,(SelectDest *)&pEList);
        if (iVar1 != 0) {
          return 0;
        }
        pEStack_90 = ((pExpr->x).pSelect)->pEList;
        if ((pEStack_90 != (ExprList *)0x0) && (0 < pEStack_90->nExpr)) {
          keyInfo.aSortOrder =
               (u8 *)sqlite3BinaryCompareCollSeq(pParse,pExpr->pLeft,pEStack_90->a->pExpr);
        }
      }
      else if ((pExpr->x).pList != (ExprList *)0x0) {
        pItem = (ExprList_item *)(pExpr->x).pList;
        if (keyInfo.aColl[0]._7_1_ == '\0') {
          keyInfo.aColl[0]._7_1_ = 'b';
        }
        keyInfo.aSortOrder = (u8 *)sqlite3ExprCollSeq(pParse,pExpr->pLeft);
        keyInfo._8_8_ = &sqlite3CodeSubselect::sortOrder;
        r3 = sqlite3GetTempReg(pParse);
        local_b0 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(p,10,0,local_b0);
        _r2 = pItem->zName;
        for (pList._4_4_ = *(int *)&pItem->pExpr; 0 < pList._4_4_; pList._4_4_ = pList._4_4_ + -1) {
          pEStack_c0 = *(Expr **)_r2;
          if ((-1 < v._4_4_) && (iVar1 = sqlite3ExprIsConstant(pEStack_c0), iVar1 == 0)) {
            sqlite3VdbeChangeToNoop(p,v._4_4_);
            v._4_4_ = -1;
          }
          if ((isRowid == 0) ||
             (iVar1 = sqlite3ExprIsInteger(pEStack_c0,(int *)((long)&pSel + 4)), iVar1 == 0)) {
            iVar1 = sqlite3ExprCodeTarget(pParse,pEStack_c0,r3);
            pE2._4_4_ = iVar1;
            if (isRowid == 0) {
              sqlite3VdbeAddOp4(p,0x1f,iVar1,1,local_b0,(char *)((long)keyInfo.aColl + 7),1);
              sqlite3ExprCacheAffinityChange(pParse,pE2._4_4_,1);
              sqlite3VdbeAddOp2(p,0x61,pExpr->iTable,local_b0);
            }
            else {
              iVar2 = sqlite3VdbeCurrentAddr(p);
              sqlite3VdbeAddOp2(p,0x15,iVar1,iVar2 + 2);
              sqlite3VdbeAddOp3(p,0x39,pExpr->iTable,local_b0,pE2._4_4_);
            }
          }
          else {
            sqlite3VdbeAddOp3(p,0x3a,pExpr->iTable,local_b0,pSel._4_4_);
          }
          _r2 = _r2 + 0x20;
        }
        sqlite3ReleaseTempReg(pParse,r3);
        sqlite3ReleaseTempReg(pParse,local_b0);
      }
      if (isRowid == 0) {
        sqlite3VdbeChangeP4(p,iVar5,local_68,-6);
      }
    }
    if (-1 < v._4_4_) {
      sqlite3VdbeJumpHere(p,v._4_4_);
    }
    sqlite3ExprCachePop(pParse,1);
    pParse_local._4_4_ = (int)v;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3CodeSubselect(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN, SELECT, or EXISTS operator */
  int rMayHaveNull,       /* Register that records whether NULLs exist in RHS */
  int isRowid             /* If true, LHS of IN operator is a rowid */
){
  int testAddr = -1;                      /* One-time test address */
  int rReg = 0;                           /* Register storing resulting */
  Vdbe *v = sqlite3GetVdbe(pParse);
  if( NEVER(v==0) ) return 0;
  sqlite3ExprCachePush(pParse);

  /* This code must be run in its entirety every time it is encountered
  ** if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can run this code just once
  ** save the results, and reuse the same result on subsequent invocations.
  */
  if( !ExprHasAnyProperty(pExpr, EP_VarSelect) ){
    testAddr = sqlite3CodeOnce(pParse);
  }

#ifndef SQLITE_OMIT_EXPLAIN
  if( pParse->explain==2 ){
    char *zMsg = sqlite3MPrintf(
        pParse->db, "EXECUTE %s%s SUBQUERY %d", testAddr>=0?"":"CORRELATED ",
        pExpr->op==TK_IN?"LIST":"SCALAR", pParse->iNextSelectId
    );
    sqlite3VdbeAddOp4(v, OP_Explain, pParse->iSelectId, 0, 0, zMsg, P4_DYNAMIC);
  }
#endif

  switch( pExpr->op ){
    case TK_IN: {
      char affinity;              /* Affinity of the LHS of the IN */
      KeyInfo keyInfo;            /* Keyinfo for the generated table */
      static u8 sortOrder = 0;    /* Fake aSortOrder for keyInfo */
      int addr;                   /* Address of OP_OpenEphemeral instruction */
      Expr *pLeft = pExpr->pLeft; /* the LHS of the IN operator */

      if( rMayHaveNull ){
        sqlite3VdbeAddOp2(v, OP_Null, 0, rMayHaveNull);
      }

      affinity = sqlite3ExprAffinity(pLeft);

      /* Whether this is an 'x IN(SELECT...)' or an 'x IN(<exprlist>)'
      ** expression it is handled the same way.  An ephemeral table is 
      ** filled with single-field index keys representing the results
      ** from the SELECT or the <exprlist>.
      **
      ** If the 'x' expression is a column value, or the SELECT...
      ** statement returns a column value, then the affinity of that
      ** column is used to build the index keys. If both 'x' and the
      ** SELECT... statement are columns, then numeric affinity is used
      ** if either column has NUMERIC or INTEGER affinity. If neither
      ** 'x' nor the SELECT... statement are columns, then numeric affinity
      ** is used.
      */
      pExpr->iTable = pParse->nTab++;
      addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pExpr->iTable, !isRowid);
      if( rMayHaveNull==0 ) sqlite3VdbeChangeP5(v, BTREE_UNORDERED);
      memset(&keyInfo, 0, sizeof(keyInfo));
      keyInfo.nField = 1;
      keyInfo.aSortOrder = &sortOrder;

      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* Case 1:     expr IN (SELECT ...)
        **
        ** Generate code to write the results of the select into the temporary
        ** table allocated and opened above.
        */
        SelectDest dest;
        ExprList *pEList;

        assert( !isRowid );
        sqlite3SelectDestInit(&dest, SRT_Set, pExpr->iTable);
        dest.affSdst = (u8)affinity;
        assert( (pExpr->iTable&0x0000FFFF)==pExpr->iTable );
        pExpr->x.pSelect->iLimit = 0;
        if( sqlite3Select(pParse, pExpr->x.pSelect, &dest) ){
          return 0;
        }
        pEList = pExpr->x.pSelect->pEList;
        if( ALWAYS(pEList!=0 && pEList->nExpr>0) ){ 
          keyInfo.aColl[0] = sqlite3BinaryCompareCollSeq(pParse, pExpr->pLeft,
              pEList->a[0].pExpr);
        }
      }else if( ALWAYS(pExpr->x.pList!=0) ){
        /* Case 2:     expr IN (exprlist)
        **
        ** For each expression, build an index key from the evaluation and
        ** store it in the temporary table. If <expr> is a column, then use
        ** that columns affinity when building index keys. If <expr> is not
        ** a column, use numeric affinity.
        */
        int i;
        ExprList *pList = pExpr->x.pList;
        struct ExprList_item *pItem;
        int r1, r2, r3;

        if( !affinity ){
          affinity = SQLITE_AFF_NONE;
        }
        keyInfo.aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
        keyInfo.aSortOrder = &sortOrder;

        /* Loop through each expression in <exprlist>. */
        r1 = sqlite3GetTempReg(pParse);
        r2 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_Null, 0, r2);
        for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
          Expr *pE2 = pItem->pExpr;
          int iValToIns;

          /* If the expression is not constant then we will need to
          ** disable the test that was generated above that makes sure
          ** this code only executes once.  Because for a non-constant
          ** expression we need to rerun this code each time.
          */
          if( testAddr>=0 && !sqlite3ExprIsConstant(pE2) ){
            sqlite3VdbeChangeToNoop(v, testAddr);
            testAddr = -1;
          }

          /* Evaluate the expression and insert it into the temp table */
          if( isRowid && sqlite3ExprIsInteger(pE2, &iValToIns) ){
            sqlite3VdbeAddOp3(v, OP_InsertInt, pExpr->iTable, r2, iValToIns);
          }else{
            r3 = sqlite3ExprCodeTarget(pParse, pE2, r1);
            if( isRowid ){
              sqlite3VdbeAddOp2(v, OP_MustBeInt, r3,
                                sqlite3VdbeCurrentAddr(v)+2);
              sqlite3VdbeAddOp3(v, OP_Insert, pExpr->iTable, r2, r3);
            }else{
              sqlite3VdbeAddOp4(v, OP_MakeRecord, r3, 1, r2, &affinity, 1);
              sqlite3ExprCacheAffinityChange(pParse, r3, 1);
              sqlite3VdbeAddOp2(v, OP_IdxInsert, pExpr->iTable, r2);
            }
          }
        }
        sqlite3ReleaseTempReg(pParse, r1);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      if( !isRowid ){
        sqlite3VdbeChangeP4(v, addr, (void *)&keyInfo, P4_KEYINFO);
      }
      break;
    }

    case TK_EXISTS:
    case TK_SELECT:
    default: {
      /* If this has to be a scalar SELECT.  Generate code to put the
      ** value of this select in a memory cell and record the number
      ** of the memory cell in iColumn.  If this is an EXISTS, write
      ** an integer 0 (not exists) or 1 (exists) into a memory cell
      ** and record that memory cell in iColumn.
      */
      Select *pSel;                         /* SELECT statement to encode */
      SelectDest dest;                      /* How to deal with SELECt result */

      testcase( pExpr->op==TK_EXISTS );
      testcase( pExpr->op==TK_SELECT );
      assert( pExpr->op==TK_EXISTS || pExpr->op==TK_SELECT );

      assert( ExprHasProperty(pExpr, EP_xIsSelect) );
      pSel = pExpr->x.pSelect;
      sqlite3SelectDestInit(&dest, 0, ++pParse->nMem);
      if( pExpr->op==TK_SELECT ){
        dest.eDest = SRT_Mem;
        sqlite3VdbeAddOp2(v, OP_Null, 0, dest.iSDParm);
        VdbeComment((v, "Init subquery result"));
      }else{
        dest.eDest = SRT_Exists;
        sqlite3VdbeAddOp2(v, OP_Integer, 0, dest.iSDParm);
        VdbeComment((v, "Init EXISTS result"));
      }
      sqlite3ExprDelete(pParse->db, pSel->pLimit);
      pSel->pLimit = sqlite3PExpr(pParse, TK_INTEGER, 0, 0,
                                  &sqlite3IntTokens[1]);
      pSel->iLimit = 0;
      if( sqlite3Select(pParse, pSel, &dest) ){
        return 0;
      }
      rReg = dest.iSDParm;
      ExprSetIrreducible(pExpr);
      break;
    }
  }

  if( testAddr>=0 ){
    sqlite3VdbeJumpHere(v, testAddr);
  }
  sqlite3ExprCachePop(pParse, 1);

  return rReg;
}